

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_interface.cpp
# Opt level: O0

bool ExrInterface::writeFrame(char *outputFile,LumaFrame *frame)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  LumaException *this;
  Rgba *pRVar4;
  float *pfVar5;
  exception *e;
  Rgba local_78;
  RgbaOutputFile file;
  Rgba *p;
  size_t x;
  size_t y;
  Array2D<Imf_2_5::Rgba> pixels;
  uint h;
  uint w;
  LumaFrame *frame_local;
  char *outputFile_local;
  
  if (frame->buffer == (float *)0x0) {
    this = (LumaException *)__cxa_allocate_exception(0x28);
    LumaException::LumaException(this,"Frame does not contain any data");
    __cxa_throw(this,&LumaException::typeinfo,LumaException::~LumaException);
  }
  uVar1 = frame->width;
  pixels._data._4_4_ = frame->height;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D((Array2D<Imf_2_5::Rgba> *)&y);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
            ((Array2D<Imf_2_5::Rgba> *)&y,(ulong)pixels._data._4_4_,(ulong)uVar1);
  for (x = 0; uVar2 = pixels._data._4_4_, x < pixels._data._4_4_; x = x + 1) {
    for (p = (Rgba *)0x0; p < (Rgba *)(ulong)uVar1; p = (Rgba *)((long)&(p->r)._h + 1)) {
      pRVar4 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&y,x);
      pRVar4 = pRVar4 + (long)p;
      pfVar5 = LumaFrame::getChannel(frame,0);
      half::operator=(&pRVar4->r,pfVar5[(long)((long)&(p->r)._h + x * uVar1)]);
      pfVar5 = LumaFrame::getChannel(frame,1);
      half::operator=(&pRVar4->g,pfVar5[(long)((long)&(p->r)._h + x * uVar1)]);
      pfVar5 = LumaFrame::getChannel(frame,2);
      half::operator=(&pRVar4->b,pfVar5[(long)((long)&(p->r)._h + x * uVar1)]);
      half::operator=(&pRVar4->a,0.0);
    }
  }
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&e,0.0,0.0);
  uVar3 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,&local_78,outputFile,uVar1,uVar2,7,&e,0,4,uVar3);
  pRVar4 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&y,0);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&local_78,(ulong)pRVar4,1);
  Imf_2_5::RgbaOutputFile::writePixels((int)&local_78);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&local_78);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&y);
  return true;
}

Assistant:

bool ExrInterface::writeFrame(const char *outputFile, LumaFrame &frame)
{
    if (frame.buffer == NULL)
        throw LumaException("Frame does not contain any data");
    
    try
    {
        unsigned int w = frame.width, h = frame.height;
        Array2D<Rgba> pixels;
        pixels.resizeErase(h, w);
        for (size_t y=0; y<h; y++)
	        for (size_t x=0; x<w; x++)
	        {
	            Rgba &p = pixels[y][x];
	            p.r = frame.getChannel(0)[x+y*w];
	            p.g = frame.getChannel(1)[x+y*w];
	            p.b = frame.getChannel(2)[x+y*w];
	            p.a = 0;
	        }
        
        RgbaOutputFile file(outputFile, w, h, WRITE_RGB);
        file.setFrameBuffer(&pixels[0][0], 1, w);
        file.writePixels(h);
    }
    catch (const std::exception &e)
    {
        throw LumaException(e.what());
    }
    
    return 1;
}